

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MosquitoNet.h
# Opt level: O0

void __thiscall
Enhedron::Assertion::Impl::Configurable::VariableValueExpression<bool>::appendVariables
          (VariableValueExpression<bool> *this,
          vector<Enhedron::Assertion::Impl::Configurable::Variable,_std::allocator<Enhedron::Assertion::Impl::Configurable::Variable>_>
          *variableList)

{
  bool in_DL;
  string local_38;
  vector<Enhedron::Assertion::Impl::Configurable::Variable,_std::allocator<Enhedron::Assertion::Impl::Configurable::Variable>_>
  *local_18;
  vector<Enhedron::Assertion::Impl::Configurable::Variable,_std::allocator<Enhedron::Assertion::Impl::Configurable::Variable>_>
  *variableList_local;
  VariableValueExpression<bool> *this_local;
  
  local_18 = variableList;
  variableList_local =
       (vector<Enhedron::Assertion::Impl::Configurable::Variable,_std::allocator<Enhedron::Assertion::Impl::Configurable::Variable>_>
        *)this;
  Convert<bool,void>::toString_abi_cxx11_
            (&local_38,(Convert<bool,void> *)(ulong)(this->value & 1),in_DL);
  std::
  vector<Enhedron::Assertion::Impl::Configurable::Variable,std::allocator<Enhedron::Assertion::Impl::Configurable::Variable>>
  ::emplace_back<char_const*const&,std::__cxx11::string,char_const*const&,int_const&>
            ((vector<Enhedron::Assertion::Impl::Configurable::Variable,std::allocator<Enhedron::Assertion::Impl::Configurable::Variable>>
              *)variableList,&this->variableName,&local_38,&this->file,&this->line);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void appendVariables(vector<Variable> &variableList) const {
            variableList.emplace_back(variableName, Convert<Value>::toString(value), file, line);
        }